

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lackey.cc
# Opt level: O0

bool __thiscall
gss::innards::Lackey::check_solution
          (Lackey *this,VertexToVertexMapping *m,bool partial,bool all_solutions,
          function<bool_(int,_int)> *deletion)

{
  string_view n_00;
  string_view n_01;
  bool bVar1;
  byte bVar2;
  __type _Var3;
  undefined1 uVar4;
  pointer pIVar5;
  ostream *poVar6;
  size_type sVar7;
  istream *piVar8;
  undefined8 uVar9;
  long *plVar10;
  int *piVar11;
  byte in_CL;
  byte in_DL;
  undefined8 in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  optional<int> t_1;
  int j;
  optional<int> p_1;
  int m_1;
  string v_1;
  string k_1;
  int i_1;
  string v;
  string k;
  int i;
  int n;
  string response;
  bool result;
  string operation;
  type *t;
  type *p;
  const_iterator __end1;
  const_iterator __begin1;
  VertexToVertexMapping *__range1;
  string command;
  unique_lock<std::mutex> lock;
  int in_stack_fffffffffffff7e8;
  int in_stack_fffffffffffff7ec;
  undefined7 in_stack_fffffffffffff7f0;
  undefined1 in_stack_fffffffffffff7f7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7f8;
  int in_stack_fffffffffffff800;
  undefined4 in_stack_fffffffffffff804;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff808;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff810;
  InputGraph *in_stack_fffffffffffff818;
  undefined7 in_stack_fffffffffffff820;
  byte in_stack_fffffffffffff827;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff828;
  int __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff830;
  _Optional_payload_base<int> in_stack_fffffffffffff838;
  string *this_00;
  undefined6 in_stack_fffffffffffff868;
  undefined1 in_stack_fffffffffffff86e;
  int local_5ac;
  int local_4a4;
  string local_4a0 [32];
  string local_480 [32];
  int local_460;
  undefined1 local_459;
  string local_3b8 [32];
  string local_398 [32];
  int local_378;
  undefined1 local_371;
  int local_2d0;
  undefined1 local_2c9;
  undefined1 local_201;
  string local_1c0 [38];
  byte local_19a;
  undefined1 local_199;
  string local_118 [38];
  undefined1 local_f2;
  string local_d0 [32];
  string local_b0 [32];
  type_conflict3 *local_90;
  type *local_88;
  reference local_80;
  _Self local_78;
  _Self local_70;
  undefined8 local_68;
  string local_50 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  byte local_12;
  byte local_11;
  undefined8 local_10;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  local_20 = in_R8;
  local_10 = in_RSI;
  std::unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>::
  operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
              *)0x18896b);
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)
             CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0),
             (mutex_type *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  pIVar5 = std::
           unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>::
           operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                       *)0x188988);
  pIVar5->number_of_calls = pIVar5->number_of_calls + 1;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800));
  if ((local_11 & 1) == 0) {
    pIVar5 = std::
             unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
             ::operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                           *)0x188a5c);
    pIVar5->number_of_checks = pIVar5->number_of_checks + 1;
    if ((local_12 & 1) == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0),
                 (char *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0),
                 (char *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    }
  }
  else {
    bVar1 = std::function::operator_cast_to_bool((function<bool_(int,_int)> *)0x1889c2);
    if (bVar1) {
      pIVar5 = std::
               unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
               ::operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                             *)0x1889d5);
      pIVar5->number_of_propagations = pIVar5->number_of_propagations + 1;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0),
                 (char *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    }
    else {
      pIVar5 = std::
               unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
               ::operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                             *)0x188a24);
      pIVar5->number_of_checks = pIVar5->number_of_checks + 1;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0),
                 (char *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    }
  }
  pIVar5 = std::
           unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>::
           operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                       *)0x188ab7);
  poVar6 = std::operator<<((ostream *)&pIVar5->send_to,local_50);
  poVar6 = std::operator<<(poVar6," ");
  sVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::size
                    ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     0x188b00);
  std::ostream::operator<<(poVar6,sVar7);
  local_68 = local_10;
  local_70._M_node =
       (_Base_ptr)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                 ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                  CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  local_78._M_node =
       (_Base_ptr)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                 ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                  CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  while (bVar1 = std::operator==(&local_70,&local_78), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_80 = std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator*
                         ((_Rb_tree_const_iterator<std::pair<const_int,_int>_> *)
                          CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
    local_88 = std::get<0ul,int_const,int>((pair<const_int,_int> *)0x188b8e);
    local_90 = std::get<1ul,int_const,int>((pair<const_int,_int> *)0x188ba3);
    pIVar5 = std::
             unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
             ::operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                           *)0x188bb8);
    poVar6 = std::operator<<((ostream *)&pIVar5->send_to," ");
    std::unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>::
    operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                *)0x188be2);
    InputGraph::vertex_name_abi_cxx11_
              (in_stack_fffffffffffff818,(int)((ulong)in_stack_fffffffffffff810 >> 0x20));
    poVar6 = std::operator<<(poVar6,local_b0);
    poVar6 = std::operator<<(poVar6," ");
    std::unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>::
    operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                *)0x188c4c);
    InputGraph::vertex_name_abi_cxx11_
              (in_stack_fffffffffffff818,(int)((ulong)in_stack_fffffffffffff810 >> 0x20));
    std::operator<<(poVar6,local_d0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
    std::_Rb_tree_const_iterator<std::pair<const_int,_int>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_int,_int>_> *)
               CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
  }
  pIVar5 = std::
           unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>::
           operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                       *)0x188d05);
  std::ostream::operator<<(&pIVar5->send_to,std::endl<char,std::char_traits<char>>);
  pIVar5 = std::
           unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>::
           operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                       *)0x188d27);
  bVar2 = std::ios::operator!((ios *)(&pIVar5->send_to +
                                     *(long *)(*(long *)&pIVar5->send_to + -0x18)));
  if ((bVar2 & 1) != 0) {
    local_f2 = 1;
    uVar9 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff830,(char *)in_stack_fffffffffffff828,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820));
    DisobedientLackeyError::DisobedientLackeyError
              ((DisobedientLackeyError *)
               CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0),
               (string *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    local_f2 = 0;
    __cxa_throw(uVar9,&DisobedientLackeyError::typeinfo,
                DisobedientLackeyError::~DisobedientLackeyError);
  }
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800));
  pIVar5 = std::
           unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>::
           operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                       *)0x188e60);
  piVar8 = std::operator>>((istream *)&pIVar5->read_from,local_118);
  bVar2 = std::ios::operator!((ios *)(piVar8 + *(long *)(*(long *)piVar8 + -0x18)));
  if (((bVar2 & 1) != 0) ||
     (_Var3 = std::operator==(in_stack_fffffffffffff810,in_stack_fffffffffffff808),
     ((_Var3 ^ 0xffU) & 1) != 0)) {
    local_199 = 1;
    uVar9 = __cxa_allocate_exception(0x28);
    std::operator+((char *)in_stack_fffffffffffff838,in_stack_fffffffffffff830);
    std::operator+(in_stack_fffffffffffff7f8,
                   (char *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
    std::operator+(in_stack_fffffffffffff7f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
    std::operator+(in_stack_fffffffffffff7f8,
                   (char *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
    DisobedientLackeyError::DisobedientLackeyError
              ((DisobedientLackeyError *)
               CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0),
               (string *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    local_199 = 0;
    __cxa_throw(uVar9,&DisobedientLackeyError::typeinfo,
                DisobedientLackeyError::~DisobedientLackeyError);
  }
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800));
  pIVar5 = std::
           unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>::
           operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                       *)0x18909a);
  piVar8 = std::operator>>((istream *)&pIVar5->read_from,local_1c0);
  bVar2 = std::ios::operator!((ios *)(piVar8 + *(long *)(*(long *)piVar8 + -0x18)));
  if ((bVar2 & 1) != 0) {
    local_201 = 1;
    uVar9 = __cxa_allocate_exception(0x28);
    std::operator+((char *)in_stack_fffffffffffff838,in_stack_fffffffffffff830);
    std::operator+(in_stack_fffffffffffff7f8,
                   (char *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
    DisobedientLackeyError::DisobedientLackeyError
              ((DisobedientLackeyError *)
               CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0),
               (string *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    local_201 = 0;
    __cxa_throw(uVar9,&DisobedientLackeyError::typeinfo,
                DisobedientLackeyError::~DisobedientLackeyError);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0),
                          (char *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  if (bVar1) {
    local_19a = 1;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0),
                            (char *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    if (!bVar1) {
      local_2c9 = 1;
      uVar9 = __cxa_allocate_exception(0x28);
      std::operator+((char *)in_stack_fffffffffffff838,in_stack_fffffffffffff830);
      std::operator+(in_stack_fffffffffffff7f8,
                     (char *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
      std::operator+(in_stack_fffffffffffff7f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
      std::operator+(in_stack_fffffffffffff7f8,
                     (char *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
      std::operator+(in_stack_fffffffffffff7f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
      std::operator+(in_stack_fffffffffffff7f8,
                     (char *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
      DisobedientLackeyError::DisobedientLackeyError
                ((DisobedientLackeyError *)
                 CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0),
                 (string *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
      local_2c9 = 0;
      __cxa_throw(uVar9,&DisobedientLackeyError::typeinfo,
                  DisobedientLackeyError::~DisobedientLackeyError);
    }
    local_19a = 0;
  }
  pIVar5 = std::
           unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>::
           operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                       *)0x1894a8);
  plVar10 = (long *)std::istream::operator>>(&pIVar5->read_from,&local_2d0);
  bVar2 = std::ios::operator!((ios *)((long)plVar10 + *(long *)(*plVar10 + -0x18)));
  if ((bVar2 & 1) == 0) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0),
                            (char *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    if (bVar1) {
      for (local_378 = 0; local_378 < local_2d0; local_378 = local_378 + 1) {
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800));
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800));
        pIVar5 = std::
                 unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                 ::operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                               *)0x189741);
        piVar8 = std::operator>>((istream *)&pIVar5->read_from,local_398);
        piVar8 = std::operator>>(piVar8,local_3b8);
        bVar2 = std::ios::operator!((ios *)(piVar8 + *(long *)(*(long *)piVar8 + -0x18)));
        __val = (int)((ulong)in_stack_fffffffffffff828 >> 0x20);
        if ((bVar2 & 1) != 0) {
          local_459 = 1;
          uVar9 = __cxa_allocate_exception(0x28);
          std::__cxx11::to_string(__val);
          std::operator+((char *)in_stack_fffffffffffff7f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
          std::operator+(in_stack_fffffffffffff7f8,
                         (char *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
          std::operator+(in_stack_fffffffffffff7f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
          std::operator+(in_stack_fffffffffffff7f8,
                         (char *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
          DisobedientLackeyError::DisobedientLackeyError
                    ((DisobedientLackeyError *)
                     CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0),
                     (string *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
          local_459 = 0;
          __cxa_throw(uVar9,&DisobedientLackeyError::typeinfo,
                      DisobedientLackeyError::~DisobedientLackeyError);
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
      }
    }
    else {
      uVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0),
                              (char *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8))
      ;
      if (((bool)uVar4) ||
         (in_stack_fffffffffffff86e =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0),
                               (char *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8)
                              ), (bool)in_stack_fffffffffffff86e)) {
        for (local_460 = 0; local_460 < local_2d0; local_460 = local_460 + 1) {
          this_00 = local_480;
          std::__cxx11::string::string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800));
          std::__cxx11::string::string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800));
          pIVar5 = std::
                   unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                   ::operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                                 *)0x189a8a);
          piVar8 = std::operator>>((istream *)&pIVar5->read_from,this_00);
          plVar10 = (long *)std::istream::operator>>(piVar8,&local_4a4);
          bVar2 = std::ios::operator!((ios *)((long)plVar10 + *(long *)(*plVar10 + -0x18)));
          if ((bVar2 & 1) != 0) {
            uVar9 = __cxa_allocate_exception(0x28);
            std::operator+((char *)in_stack_fffffffffffff838,in_stack_fffffffffffff830);
            std::operator+(in_stack_fffffffffffff7f8,
                           (char *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
            std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff828 >> 0x20));
            std::operator+(in_stack_fffffffffffff828,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820));
            std::operator+(in_stack_fffffffffffff7f8,
                           (char *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
            std::operator+(in_stack_fffffffffffff7f8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
            std::operator+(in_stack_fffffffffffff7f8,
                           (char *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
            DisobedientLackeyError::DisobedientLackeyError
                      ((DisobedientLackeyError *)
                       CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0),
                       (string *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
            __cxa_throw(uVar9,&DisobedientLackeyError::typeinfo,
                        DisobedientLackeyError::~DisobedientLackeyError);
          }
          pIVar5 = std::
                   unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                   ::operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                                 *)0x189d55);
          in_stack_fffffffffffff830 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               pIVar5->pattern_graph;
          std::__cxx11::string::operator_cast_to_basic_string_view
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
          n_00._M_str._0_6_ = in_stack_fffffffffffff868;
          n_00._M_len = (size_t)piVar8;
          n_00._M_str._6_1_ = in_stack_fffffffffffff86e;
          n_00._M_str._7_1_ = uVar4;
          in_stack_fffffffffffff838 =
               (_Optional_payload_base<int>)InputGraph::vertex_from_name((InputGraph *)this_00,n_00)
          ;
          for (local_5ac = 0; local_5ac < local_4a4; local_5ac = local_5ac + 1) {
            pIVar5 = std::
                     unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                     ::operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                                   *)0x189dd8);
            in_stack_fffffffffffff828 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::operator>>((istream *)&pIVar5->read_from,local_4a0);
            in_stack_fffffffffffff827 =
                 std::ios::operator!((ios *)((long)&(in_stack_fffffffffffff828->_M_dataplus)._M_p +
                                            *(long *)((in_stack_fffffffffffff828->_M_dataplus)._M_p
                                                     + -0x18)));
            if ((in_stack_fffffffffffff827 & 1) != 0) {
              uVar9 = __cxa_allocate_exception(0x28);
              std::operator+((char *)in_stack_fffffffffffff838,in_stack_fffffffffffff830);
              std::operator+(in_stack_fffffffffffff7f8,
                             (char *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
              std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff828 >> 0x20));
              std::operator+(in_stack_fffffffffffff828,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820));
              std::operator+(in_stack_fffffffffffff7f8,
                             (char *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
              std::operator+(in_stack_fffffffffffff7f8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
              std::operator+(in_stack_fffffffffffff7f8,
                             (char *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
              DisobedientLackeyError::DisobedientLackeyError
                        ((DisobedientLackeyError *)
                         CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0),
                         (string *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
              __cxa_throw(uVar9,&DisobedientLackeyError::typeinfo,
                          DisobedientLackeyError::~DisobedientLackeyError);
            }
            bVar1 = std::function::operator_cast_to_bool((function<bool_(int,_int)> *)0x18a074);
            if (bVar1) {
              std::
              unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
              ::operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                            *)0x18a08a);
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
              n_01._M_str._0_6_ = in_stack_fffffffffffff868;
              n_01._M_len = (size_t)piVar8;
              n_01._M_str._6_1_ = in_stack_fffffffffffff86e;
              n_01._M_str._7_1_ = uVar4;
              InputGraph::vertex_from_name((InputGraph *)this_00,n_01);
              bVar1 = std::optional::operator_cast_to_bool((optional<int> *)0x18a0ee);
              if ((bVar1) &&
                 (bVar1 = std::optional::operator_cast_to_bool((optional<int> *)0x18a104), bVar1)) {
                in_stack_fffffffffffff7f8 = local_20;
                piVar11 = std::optional<int>::operator*((optional<int> *)0x18a124);
                in_stack_fffffffffffff800 = *piVar11;
                std::optional<int>::operator*((optional<int> *)0x18a137);
                bVar1 = std::function<bool_(int,_int)>::operator()
                                  ((function<bool_(int,_int)> *)
                                   CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0),
                                   in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8);
                in_stack_fffffffffffff804 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff804);
                if (bVar1) {
                  pIVar5 = std::
                           unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                           ::operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                                         *)0x18a164);
                  pIVar5->number_of_deletions = pIVar5->number_of_deletions + 1;
                }
              }
            }
          }
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
        }
      }
    }
    bVar2 = local_19a;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(local_19a,in_stack_fffffffffffff7f0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(bVar2,in_stack_fffffffffffff7f0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(bVar2,in_stack_fffffffffffff7f0));
    std::unique_lock<std::mutex>::~unique_lock
              ((unique_lock<std::mutex> *)CONCAT17(bVar2,in_stack_fffffffffffff7f0));
    return (bool)(bVar2 & 1);
  }
  local_371 = 1;
  uVar9 = __cxa_allocate_exception(0x28);
  std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff828 >> 0x20));
  std::operator+((char *)in_stack_fffffffffffff7f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
  std::operator+(in_stack_fffffffffffff7f8,
                 (char *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
  std::operator+(in_stack_fffffffffffff7f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
  std::operator+(in_stack_fffffffffffff7f8,
                 (char *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
  DisobedientLackeyError::DisobedientLackeyError
            ((DisobedientLackeyError *)CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0)
             ,(string *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
  local_371 = 0;
  __cxa_throw(uVar9,&DisobedientLackeyError::typeinfo,
              DisobedientLackeyError::~DisobedientLackeyError);
}

Assistant:

auto Lackey::check_solution(
    const VertexToVertexMapping & m,
    bool partial,
    bool all_solutions,
    const function<auto(int, int)->bool> & deletion) -> bool
{
    unique_lock<mutex> lock{_imp->external_solver_mutex};
    ++_imp->number_of_calls;

    string command;
    if (partial) {
        if (deletion) {
            ++_imp->number_of_propagations;
            command = "P";
        }
        else {
            ++_imp->number_of_checks;
            command = "C";
        }
    }
    else {
        ++_imp->number_of_checks;
        if (all_solutions)
            command = "A";
        else
            command = "F";
    }

    _imp->send_to << command << " " << m.size();
    for (auto & [p, t] : m)
        _imp->send_to << " " << _imp->pattern_graph.vertex_name(p) << " " << _imp->target_graph.vertex_name(t);
    _imp->send_to << endl;

    if (! _imp->send_to)
        throw DisobedientLackeyError{"error giving lackey its orders"};

    string operation;
    if (! (_imp->read_from >> operation) || operation != command)
        throw DisobedientLackeyError{"asked lackey to " + command + ", but it replied with '" + operation + "'"};

    bool result;
    string response;
    if (! (_imp->read_from >> response))
        throw DisobedientLackeyError{"asked lackey to " + command + ", but it gave no T/F"};
    else if (response == "T")
        result = true;
    else if (response == "F")
        result = false;
    else
        throw DisobedientLackeyError{"asked lackey to " + command + " but it replied with '" + operation + "' then '" + response + "'"};

    int n;
    if (! (_imp->read_from >> n))
        throw DisobedientLackeyError{"lackey replied with length '" + to_string(n) + "' to " + command + " query"};

    if (command == "S") {
        for (int i = 0; i < n; ++i) {
            string k, v;
            if (! (_imp->read_from >> k >> v))
                throw DisobedientLackeyError{"lackey gave bad response pair " + to_string(i) + " to " + command + " query"};
        }
    }
    else if (command == "C" || command == "P") {
        for (int i = 0; i < n; ++i) {
            string k, v;
            int m;
            if (! (_imp->read_from >> k >> m))
                throw DisobedientLackeyError{"lackey gave bad response pair " + k + " " + to_string(m) + " to " + command + " query"};
            auto p = _imp->pattern_graph.vertex_from_name(k);

            for (int j = 0; j < m; ++j) {
                if (! (_imp->read_from >> v))
                    throw DisobedientLackeyError{"lackey gave bad response pair " + k + " " + to_string(m) + " to " + command + " query"};

                if (deletion) {
                    auto t = _imp->target_graph.vertex_from_name(v);
                    if (p && t)
                        if (deletion(*p, *t))
                            ++_imp->number_of_deletions;
                }
            }
        }
    }

    return result;
}